

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O0

bool __thiscall kj::CidrRange::matches(CidrRange *this,sockaddr *addr)

{
  bool bVar1;
  bool local_89;
  ArrayPtr<const_unsigned_char> local_78;
  ArrayPtr<const_unsigned_char> local_68;
  ArrayPtr<const_unsigned_char> local_58;
  ArrayPtr<const_unsigned_char> local_48;
  ArrayPtr<const_unsigned_char> local_38;
  char *local_28;
  byte *otherBits;
  sockaddr *addr_local;
  CidrRange *this_local;
  
  otherBits = (byte *)addr;
  addr_local = (sockaddr *)this;
  if (this->family == 2) {
    if (addr->sa_family == 10) {
      local_28 = addr->sa_data + 6;
      local_38 = arrayPtr<unsigned_char_const>((uchar *)local_28,0xc);
      ArrayPtr<unsigned_char_const>::ArrayPtr<12ul>
                ((ArrayPtr<unsigned_char_const> *)&local_48,(uchar (*) [12])"");
      bVar1 = ArrayPtr<const_unsigned_char>::operator==(&local_38,&local_48);
      if (!bVar1) {
        return false;
      }
      local_28 = local_28 + 0xc;
    }
    else {
      if (addr->sa_family != 2) {
        return false;
      }
      local_28 = addr->sa_data + 2;
    }
  }
  else {
    if (this->family != 10) {
      kj::_::unreachable();
    }
    if (addr->sa_family != 10) {
      return false;
    }
    local_28 = addr->sa_data + 6;
  }
  local_68 = arrayPtr<unsigned_char_const,16ul>(&this->bits);
  local_58 = ArrayPtr<const_unsigned_char>::first(&local_68,(ulong)(this->bitCount >> 3));
  local_78 = arrayPtr<unsigned_char_const>((uchar *)local_28,(ulong)(this->bitCount >> 3));
  bVar1 = ArrayPtr<const_unsigned_char>::operator==(&local_58,&local_78);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_89 = true;
    if (this->bitCount != 0x80) {
      local_89 = (uint)this->bits[this->bitCount >> 3] ==
                 ((uint)(byte)local_28[this->bitCount >> 3] & 0xff00 >> ((byte)this->bitCount & 7));
    }
    this_local._7_1_ = local_89;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CidrRange::matches(const struct sockaddr* addr) const {
  const byte* otherBits;

  switch (family) {
    case AF_INET:
      if (addr->sa_family == AF_INET6) {
        otherBits = reinterpret_cast<const struct sockaddr_in6*>(addr)->sin6_addr.s6_addr;
        static constexpr byte V6MAPPED[12] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0xff };
        if (arrayPtr(otherBits, sizeof(V6MAPPED)) == V6MAPPED) {
          // We're an ipv4 range and the address is ipv6, but it's a "v6 mapped" address, meaning
          // it's equivalent to an ipv4 address. Try to match against the ipv4 part.
          otherBits = otherBits + sizeof(V6MAPPED);
        } else {
          return false;
        }
      } else if (addr->sa_family == AF_INET) {
        otherBits = reinterpret_cast<const byte*>(
            &reinterpret_cast<const struct sockaddr_in*>(addr)->sin_addr.s_addr);
      } else {
        return false;
      }

      break;

    case AF_INET6:
      if (addr->sa_family != AF_INET6) return false;

      otherBits = reinterpret_cast<const struct sockaddr_in6*>(addr)->sin6_addr.s6_addr;
      break;

    default:
      KJ_UNREACHABLE;
  }

  if (arrayPtr(bits).first(bitCount / 8) != arrayPtr(otherBits, bitCount / 8)) return false;

  return bitCount == 128 ||
      bits[bitCount / 8] == (otherBits[bitCount / 8] & (0xff00 >> (bitCount % 8)));
}